

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utScenePreprocessor.cpp
# Opt level: O0

void __thiscall
ScenePreprocessorTest_testMeshPreprocessingNeg_Test::
~ScenePreprocessorTest_testMeshPreprocessingNeg_Test
          (ScenePreprocessorTest_testMeshPreprocessingNeg_Test *this)

{
  ScenePreprocessorTest_testMeshPreprocessingNeg_Test *this_local;
  
  ~ScenePreprocessorTest_testMeshPreprocessingNeg_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(ScenePreprocessorTest, testMeshPreprocessingNeg) {
    aiMesh* p = new aiMesh;
    p->mPrimitiveTypes = aiPrimitiveType_TRIANGLE|aiPrimitiveType_POLYGON;
    ProcessMesh(p);

    // should be unmodified
    EXPECT_EQ(static_cast<unsigned int>(aiPrimitiveType_TRIANGLE|aiPrimitiveType_POLYGON),
              p->mPrimitiveTypes);

    delete p;
}